

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-timed.c
# Opt level: O1

_Bool mon_clear_timed(monster *mon,wchar_t effect_type,wchar_t flag)

{
  _Bool _Var1;
  
  if (effect_type < L'\0') {
    __assert_fail("effect_type >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/mon-timed.c"
                  ,0x136,"_Bool mon_clear_timed(struct monster *, int, int)");
  }
  if (effect_type < L'\n') {
    if (mon->m_timed[(uint)effect_type] != 0) {
      _Var1 = mon_set_timed(mon,effect_type,L'\0',flag);
      return _Var1;
    }
    return false;
  }
  __assert_fail("effect_type < MON_TMD_MAX",
                "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/mon-timed.c"
                ,0x137,"_Bool mon_clear_timed(struct monster *, int, int)");
}

Assistant:

bool mon_clear_timed(struct monster *mon, int effect_type, int flag)
{
	assert(effect_type >= 0);
	assert(effect_type < MON_TMD_MAX);

	if (mon->m_timed[effect_type] == 0) {
		return false;
	} else {
		return mon_set_timed(mon, effect_type, 0, flag);
	}
}